

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O2

bool __thiscall ON_Quaternion::GetRotation(ON_Quaternion *this,ON_Xform *xform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  double *pdVar8;
  long lVar9;
  ON_Xform *pOVar10;
  byte bVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  ON_Quaternion local_68;
  double local_40;
  double local_38;
  double dStack_30;
  
  bVar11 = 0;
  local_68.a = this->a;
  local_68.b = this->b;
  local_68.c = this->c;
  local_68.d = this->d;
  bVar6 = Unitize(&local_68);
  if (bVar6) {
    if ((((ABS(local_68.a - this->a) <= 2.3283064365386963e-10) &&
         (ABS(local_68.b - this->b) <= 2.3283064365386963e-10)) &&
        (ABS(local_68.c - this->c) <= 2.3283064365386963e-10)) &&
       (ABS(local_68.d - this->d) <= 2.3283064365386963e-10)) {
      local_68.a = this->a;
      local_68.b = this->b;
      local_68.c = this->c;
      local_68.d = this->d;
    }
    dVar3 = local_68.b;
    dVar2 = local_68.a;
    pdVar8 = ON_Xform::operator[](xform,1);
    dVar5 = local_68.d;
    dVar4 = local_68.c;
    local_38 = local_68.c * dVar2;
    dStack_30 = local_68.d;
    dVar13 = dVar2 * local_68.d;
    dVar14 = dVar3 * local_68.c;
    dVar1 = dVar14 + dVar13;
    *pdVar8 = dVar1 + dVar1;
    dVar12 = dVar3 * local_68.d;
    local_40 = dVar12 - local_38;
    local_40 = local_40 + local_40;
    pdVar8 = ON_Xform::operator[](xform,2);
    *pdVar8 = local_40;
    pdVar8 = ON_Xform::operator[](xform,3);
    *pdVar8 = 0.0;
    dVar14 = dVar14 - dVar13;
    pdVar8 = ON_Xform::operator[](xform,0);
    pdVar8[1] = dVar14 + dVar14;
    dVar1 = dVar5 * dVar4 + dVar3 * dVar2;
    pdVar8 = ON_Xform::operator[](xform,2);
    pdVar8[1] = dVar1 + dVar1;
    pdVar8 = ON_Xform::operator[](xform,3);
    pdVar8[1] = 0.0;
    dVar12 = dVar12 + local_38;
    pdVar8 = ON_Xform::operator[](xform,0);
    pdVar8[2] = dVar12 + dVar12;
    dVar1 = dVar5 * dVar4 - dVar3 * dVar2;
    pdVar8 = ON_Xform::operator[](xform,1);
    pdVar8[2] = dVar1 + dVar1;
    pdVar8 = ON_Xform::operator[](xform,3);
    pdVar8[2] = 0.0;
    dVar1 = dVar4 * dVar4 + dVar5 * dVar5;
    pdVar8 = ON_Xform::operator[](xform,0);
    *pdVar8 = 1.0 - (dVar1 + dVar1);
    dVar1 = dVar5 * dVar5 + dVar3 * dVar3;
    pdVar8 = ON_Xform::operator[](xform,1);
    pdVar8[1] = 1.0 - (dVar1 + dVar1);
    dVar1 = dVar4 * dVar4 + dVar3 * dVar3;
    pdVar8 = ON_Xform::operator[](xform,2);
    pdVar8[2] = 1.0 - (dVar1 + dVar1);
    pdVar8 = ON_Xform::operator[](xform,2);
    pdVar8[3] = 0.0;
    pdVar8 = ON_Xform::operator[](xform,1);
    pdVar8[3] = 0.0;
    pdVar8 = ON_Xform::operator[](xform,0);
    pdVar8[3] = 0.0;
    pdVar8 = ON_Xform::operator[](xform,3);
    pdVar8[3] = 1.0;
  }
  else {
    bVar7 = IsZero(this);
    if (bVar7) {
      pOVar10 = &ON_Xform::Zero4x4;
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_quaternion.cpp"
                 ,0x125,"","ON_Quaternion::GetRotation(ON_Xform) quaternion is invalid");
      pOVar10 = &ON_Xform::IdentityTransformation;
    }
    for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
      xform->m_xform[0][0] = pOVar10->m_xform[0][0];
      pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar11 * -2 + 1) * 8);
      xform = (ON_Xform *)((long)xform + ((ulong)bVar11 * -2 + 1) * 8);
    }
  }
  return bVar6;
}

Assistant:

bool ON_Quaternion::GetRotation(ON_Xform& xform) const
{
  bool rc;
  ON_Quaternion q(*this);
  if ( q.Unitize() )
  {
    if (    fabs(q.a-a) <= ON_ZERO_TOLERANCE
         && fabs(q.b-b) <= ON_ZERO_TOLERANCE
         && fabs(q.c-c) <= ON_ZERO_TOLERANCE
         && fabs(q.d-d) <= ON_ZERO_TOLERANCE
         )
    {
      // "this" was already unitized - don't tweak bits
      q = *this;
    }
    xform[1][0] = 2.0*(q.b*q.c + q.a*q.d);
    xform[2][0] = 2.0*(q.b*q.d - q.a*q.c);
    xform[3][0] = 0.0;

    xform[0][1] = 2.0*(q.b*q.c - q.a*q.d);
    xform[2][1] = 2.0*(q.c*q.d + q.a*q.b);
    xform[3][1] = 0.0;

    xform[0][2] = 2.0*(q.b*q.d + q.a*q.c);
    xform[1][2] = 2.0*(q.c*q.d - q.a*q.b);
    xform[3][2] = 0.0;

    q.b = q.b*q.b;
    q.c = q.c*q.c;
    q.d = q.d*q.d;
    xform[0][0] = 1.0 - 2.0*(q.c + q.d);
    xform[1][1] = 1.0 - 2.0*(q.b + q.d);
    xform[2][2] = 1.0 - 2.0*(q.b + q.c);

    xform[0][3] = xform[1][3] = xform[2][3] = 0.0;
    xform[3][3] = 1.0;
    rc = true;
  }
  else if ( IsZero() )
  {
    xform = ON_Xform::Zero4x4;
    rc = false;
  }
  else
  {
    // something is seriously wrong
    ON_ERROR("ON_Quaternion::GetRotation(ON_Xform) quaternion is invalid");
    xform = ON_Xform::IdentityTransformation;
    rc = false;
  }

  return rc;
}